

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

float * Abc_NtkGetCoRequiredFloats(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pNode;
  float *pfVar2;
  Abc_Time_t *pAVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  float fVar6;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pVVar5 = pNtk->vCos;
    iVar1 = pVVar5->nSize;
    pfVar2 = (float *)calloc((long)iVar1,4);
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar5->pArray[lVar4];
        pAVar3 = Abc_NodeReadRequired(pNode);
        fVar6 = pAVar3->Rise;
        pAVar3 = Abc_NodeReadRequired(pNode);
        if (pAVar3->Fall <= fVar6) {
          fVar6 = pAVar3->Fall;
        }
        pfVar2[lVar4] = fVar6;
        lVar4 = lVar4 + 1;
        pVVar5 = pNtk->vCos;
      } while (lVar4 < pVVar5->nSize);
    }
  }
  return pfVar2;
}

Assistant:

float * Abc_NtkGetCoRequiredFloats( Abc_Ntk_t * pNtk )
{
    float * p;
    Abc_Obj_t * pNode;
    int i;
    if ( pNtk->pManTime == NULL )
        return NULL;
    // set the PO required times
    p = ABC_CALLOC( float, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        p[i] = Abc_NodeReadRequiredWorst(pNode);
    return p;
}